

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MessageFederateManager.cpp
# Opt level: O0

void __thiscall
helics::MessageFederateManager::~MessageFederateManager(MessageFederateManager *this)

{
  gmlc::libguarded::
  guarded_opt<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::mutex>::~guarded_opt
            ((guarded_opt<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::mutex> *)
             0x2b853f);
  gmlc::libguarded::
  shared_guarded_opt<std::deque<helics::MessageFederateManager::EndpointData,_std::allocator<helics::MessageFederateManager::EndpointData>_>,_std::shared_mutex>
  ::~shared_guarded_opt
            ((shared_guarded_opt<std::deque<helics::MessageFederateManager::EndpointData,_std::allocator<helics::MessageFederateManager::EndpointData>_>,_std::shared_mutex>
              *)0x2b8550);
  gmlc::libguarded::
  atomic_guarded<std::function<void_(helics::Endpoint_&,_TimeRepresentation<count_time<9,_long>_>)>,_std::mutex>
  ::~atomic_guarded((atomic_guarded<std::function<void_(helics::Endpoint_&,_TimeRepresentation<count_time<9,_long>_>)>,_std::mutex>
                     *)0x2b8561);
  gmlc::libguarded::
  shared_guarded_opt<gmlc::containers::DualStringMappedVector<helics::Endpoint,_helics::InterfaceHandle,_(reference_stability)0,_5>,_std::shared_mutex>
  ::~shared_guarded_opt
            ((shared_guarded_opt<gmlc::containers::DualStringMappedVector<helics::Endpoint,_helics::InterfaceHandle,_(reference_stability)0,_5>,_std::shared_mutex>
              *)0x2b856b);
  return;
}

Assistant:

MessageFederateManager::~MessageFederateManager() = default;